

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int iso9660_finish_entry(archive_write *a)

{
  void *pvVar1;
  void *pvVar2;
  mode_t mVar3;
  int iVar4;
  ssize_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong s;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined2 local_3a;
  
  pvVar1 = a->format_data;
  if (((*(long *)((long)pvVar1 + 0x10) != 0) &&
      (mVar3 = archive_entry_filetype(*(archive_entry **)(*(long *)((long)pvVar1 + 0x10) + 0x20)),
      mVar3 == 0x8000)) && (*(long *)(*(long *)((long)pvVar1 + 0x10) + 0x98) != 0)) {
    uVar6 = *(ulong *)((long)pvVar1 + 0x38);
    while (uVar6 != 0) {
      s = a->null_length;
      if (uVar6 < a->null_length) {
        s = uVar6;
      }
      sVar5 = write_iso9660_data(a,a->nulls,s);
      if (sVar5 < 0) {
        return -0x1e;
      }
      uVar6 = *(long *)((long)pvVar1 + 0x38) - s;
      *(ulong *)((long)pvVar1 + 0x38) = uVar6;
    }
    if ((*(byte *)((long)pvVar1 + 0x1d8) & 2) != 0) {
      pvVar2 = a->format_data;
      lVar7 = *(long *)((long)pvVar2 + 0x10);
      archive_entry_set_size(*(archive_entry **)(lVar7 + 0x20),*(int64_t *)((long)pvVar2 + 0x238));
      lVar8 = *(long *)((long)a->format_data + 0x102f0);
      lVar9 = *(long *)((long)a->format_data + 0x102e0);
      local_48 = 0x7d6dbc99653e437;
      local_40 = *(undefined4 *)(lVar7 + 0xc4);
      local_3c = *(undefined1 *)(lVar7 + 0xc0);
      local_3b = *(undefined1 *)(lVar7 + 0xc1);
      local_3a = 0;
      wb_set_offset(a,*(int64_t *)(lVar7 + 0x90));
      iVar4 = wb_write_to_temp(a,&local_48,0x10);
      if ((iVar4 != 0) ||
         (iVar4 = wb_write_to_temp(a,*(void **)((long)pvVar2 + 0x220),
                                   (long)*(int *)((long)pvVar2 + 0x230) << 2), iVar4 != 0)) {
        return -0x1e;
      }
      wb_set_offset(a,(lVar8 - lVar9) + 0x10000);
    }
    lVar7 = *(long *)((long)pvVar1 + 0x10);
    lVar8 = *(long *)(lVar7 + 0xb0);
    lVar9 = *(long *)(lVar8 + 8);
    if (lVar9 % 0x800 != 0) {
      iVar4 = write_null(a,0x800 - lVar9 % 0x800);
      if (iVar4 != 0) {
        return -0x1e;
      }
      lVar7 = *(long *)((long)pvVar1 + 0x10);
      lVar8 = *(long *)(lVar7 + 0xb0);
      lVar9 = *(long *)(lVar8 + 8);
    }
    *(int *)(lVar8 + 0x10) = (int)(lVar9 + 0x7ffU >> 0xb);
    *(undefined8 *)(lVar7 + 8) = 0;
    **(long **)((long)pvVar1 + 0xa0) = lVar7;
    *(long *)((long)pvVar1 + 0xa0) = lVar7 + 8;
  }
  return 0;
}

Assistant:

static int
iso9660_finish_entry(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;

	if (iso9660->cur_file == NULL)
		return (ARCHIVE_OK);
	if (archive_entry_filetype(iso9660->cur_file->entry) != AE_IFREG)
		return (ARCHIVE_OK);
	if (iso9660->cur_file->content.size == 0)
		return (ARCHIVE_OK);

	/* If there are unwritten data, write null data instead. */
	while (iso9660->bytes_remaining > 0) {
		size_t s;

		s = (iso9660->bytes_remaining > a->null_length)?
		    a->null_length: (size_t)iso9660->bytes_remaining;
		if (write_iso9660_data(a, a->nulls, s) < 0)
			return (ARCHIVE_FATAL);
		iso9660->bytes_remaining -= s;
	}

	if (iso9660->zisofs.making && zisofs_finish_entry(a) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Write padding. */
	if (wb_write_padding_to_temp(a, iso9660->cur_file->cur_content->size)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Compute the logical block number. */
	iso9660->cur_file->cur_content->blocks = (int)
	    ((iso9660->cur_file->cur_content->size
	     + LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);

	/* Add the current file to data file list. */
	isofile_add_data_file(iso9660, iso9660->cur_file);

	return (ARCHIVE_OK);
}